

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void lj_cconv_ct_ct(CTState *cts,CType *d,CType *s,uint8_t *dp,uint8_t *sp,CTInfo flags)

{
  undefined8 uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  CType *pCVar5;
  CType *s_00;
  ulong uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  CTSize esize;
  CType *dc_1;
  CType *sc;
  CType *dc;
  double n_2;
  double dStack_228;
  int32_t i_3;
  double n_1;
  double dStack_218;
  int32_t i_1;
  double n;
  uint8_t fill;
  uint8_t b_1;
  uint8_t b;
  uint8_t *puStack_208;
  MSize i;
  void *tmpptr;
  uint local_1f8;
  CTInfo sinfo;
  CTInfo dinfo;
  CTSize ssize;
  CTSize dsize;
  CTInfo flags_local;
  uint8_t *sp_local;
  uint8_t *dp_local;
  CType *s_local;
  CType *d_local;
  CTState *cts_local;
  uint32_t idx_1;
  uint local_1b4;
  uint32_t idx;
  int64_t i_2;
  CType *local_1a0;
  CTState *local_198;
  CType *local_190;
  CTState *local_188;
  CType *local_180;
  CTState *local_178;
  CType *local_170;
  CTState *local_168;
  CType *local_160;
  CTState *local_158;
  CType *local_150;
  CTState *local_148;
  CType *local_140;
  CTState *local_138;
  ulong local_f0;
  uint local_e4;
  CTState *local_e0;
  uint local_d4;
  CTState *local_d0;
  uint local_c4;
  CTState *local_c0;
  uint local_b4;
  CTState *local_b0;
  uint local_a4;
  CTState *local_a0;
  uint local_94;
  CTState *local_90;
  uint local_84;
  CTState *local_80;
  uint local_74;
  CTState *local_70;
  uint local_64;
  CTState *local_60;
  uint local_54;
  CTState *local_50;
  uint local_44;
  CTState *local_40;
  uint local_34;
  CTState *local_30;
  uint local_24;
  CTState *local_20;
  uint local_14;
  CTState *local_10;
  
  dinfo = d->size;
  sinfo = s->size;
  local_1f8 = d->info;
  uVar2 = s->info;
  tmpptr._4_4_ = uVar2;
  ssize = flags;
  _dsize = (float *)sp;
  sp_local = dp;
  dp_local = (uint8_t *)s;
  s_local = d;
  d_local = (CType *)cts;
  if ((3 < local_1f8 >> 0x1c) || (3 < uVar2 >> 0x1c)) goto LAB_0017cd92;
  idx_1._0_1_ = (byte)(local_1f8 >> 0x1a) & 0xf;
  idx_1 = (uint)(0xf436fff5fff7f021 >> ((byte)idx_1 << 2)) & 0xf;
  cts_local._0_1_ = (byte)(uVar2 >> 0x1a) & 0xf;
  cts_local._0_4_ = (uint)(0xf436fff5fff7f021 >> ((byte)cts_local << 2)) & 0xf;
  cts_local._4_4_ = uVar2;
  local_1b4 = local_1f8;
  switch((uint)cts_local + idx_1 * 8) {
  case 0:
    if (dinfo == 1) {
      *dp = *sp;
    }
    else {
      *(uint *)dp = (uint)*sp;
    }
    break;
  case 1:
    n._3_1_ = 0;
    for (n._4_4_ = 0; n._4_4_ < sinfo; n._4_4_ = n._4_4_ + 1) {
      n._3_1_ = n._3_1_ | sp[n._4_4_];
    }
    if (dinfo == 1) {
      *dp = n._3_1_ != 0;
    }
    else {
      *(uint *)dp = (uint)(n._3_1_ != 0);
    }
    break;
  case 2:
    if (sinfo == 8) {
      n._2_1_ = *(double *)sp != 0.0;
    }
    else {
      if (sinfo != 4) goto LAB_0017cd92;
      n._2_1_ = *(float *)sp != 0.0;
    }
    if (dinfo == 1) {
      *dp = n._2_1_;
    }
    else {
      *(uint *)dp = (uint)n._2_1_;
    }
    break;
  default:
    goto LAB_0017cd92;
  case 8:
  case 9:
    goto LAB_0017c0cf;
  case 10:
    goto LAB_0017c1a8;
  case 0xb:
    local_e4 = s->info & 0xffff;
    dp_local = (uint8_t *)(cts->tab + local_e4);
    sinfo = ((CType *)dp_local)->size;
    tmpptr._4_4_ = ((CType *)dp_local)->info;
    local_140 = s;
    local_138 = cts;
    local_e0 = cts;
    local_14 = local_e4;
    local_10 = cts;
    goto LAB_0017c1a8;
  case 0xd:
    if ((flags & 1) == 0) goto LAB_0017cd92;
    tmpptr._4_4_ = 0x800000;
    goto LAB_0017c0cf;
  case 0xe:
    if ((flags & 1) == 0) goto LAB_0017cd92;
    tmpptr._4_4_ = 0x800000;
    sinfo = 8;
    _dsize = (float *)&stack0xfffffffffffffdf8;
    puStack_208 = sp;
    goto LAB_0017c0cf;
  case 0x10:
  case 0x11:
    goto LAB_0017c431;
  case 0x12:
    goto LAB_0017c5da;
  case 0x13:
    local_d4 = s->info & 0xffff;
    dp_local = (uint8_t *)(cts->tab + local_d4);
    sinfo = ((CType *)dp_local)->size;
    tmpptr._4_4_ = ((CType *)dp_local)->info;
    local_150 = s;
    local_148 = cts;
    local_d0 = cts;
    local_24 = local_d4;
    local_20 = cts;
    goto LAB_0017c5da;
  case 0x19:
    local_c4 = d->info & 0xffff;
    s_local = cts->tab + local_c4;
    local_1f8 = s_local->info;
    dinfo = s_local->size;
    local_160 = d;
    local_158 = cts;
    local_c0 = cts;
    local_34 = local_c4;
    local_30 = cts;
    memset(dp + dinfo,0,(ulong)dinfo);
LAB_0017c431:
    if ((sinfo < 4) || ((sinfo == 4 && ((tmpptr._4_4_ & 0x800000) == 0)))) {
      if (sinfo == 4) {
        n_2._4_4_ = *_dsize;
      }
      else if ((tmpptr._4_4_ & 0x800000) == 0) {
        if (sinfo == 2) {
          n_2._4_4_ = (float)(int)*(short *)_dsize;
        }
        else {
          n_2._4_4_ = (float)(int)*(char *)_dsize;
        }
      }
      else if (sinfo == 2) {
        n_2._4_4_ = (float)(uint)*(ushort *)_dsize;
      }
      else {
        n_2._4_4_ = (float)(uint)*(byte *)_dsize;
      }
      dStack_228 = (double)(int)n_2._4_4_;
    }
    else if (sinfo == 4) {
      dStack_228 = (double)(uint)*_dsize;
    }
    else {
      if (sinfo != 8) goto LAB_0017cd92;
      if ((tmpptr._4_4_ & 0x800000) == 0) {
        dStack_228 = (double)*(long *)_dsize;
      }
      else {
        uVar1 = *(undefined8 *)_dsize;
        auVar8._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar8._0_8_ = uVar1;
        auVar8._12_4_ = 0x45300000;
        dStack_228 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      }
    }
    if (dinfo == 8) {
      *(double *)sp_local = dStack_228;
      return;
    }
    if (dinfo == 4) {
      *(float *)sp_local = (float)dStack_228;
      return;
    }
    goto LAB_0017cd92;
  case 0x1a:
    local_b4 = d->info & 0xffff;
    s_local = cts->tab + local_b4;
    local_1f8 = s_local->info;
    dinfo = s_local->size;
    local_170 = d;
    local_168 = cts;
    local_b0 = cts;
    local_44 = local_b4;
    local_40 = cts;
    memset(dp + dinfo,0,(ulong)dinfo);
LAB_0017c5da:
    if (sinfo != dinfo) {
      if (sinfo == 8) {
        dc = *(CType **)_dsize;
      }
      else {
        if (sinfo != 4) goto LAB_0017cd92;
        dc = (CType *)(double)*_dsize;
      }
      if (dinfo == 8) {
        *(CType **)sp_local = dc;
        return;
      }
      if (dinfo == 4) {
        *(float *)sp_local = (float)(double)dc;
        return;
      }
      goto LAB_0017cd92;
    }
    goto LAB_0017cd73;
  case 0x1b:
    if (dinfo != sinfo) {
      local_a4 = d->info & 0xffff;
      pCVar5 = cts->tab + local_a4;
      local_94 = s->info & 0xffff;
      s_00 = cts->tab + local_94;
      local_190 = s;
      local_188 = cts;
      local_180 = d;
      local_178 = cts;
      local_a0 = cts;
      local_90 = cts;
      local_64 = local_94;
      local_60 = cts;
      local_54 = local_a4;
      local_50 = cts;
      lj_cconv_ct_ct(cts,pCVar5,s_00,dp,sp,flags);
      lj_cconv_ct_ct((CTState *)d_local,pCVar5,s_00,sp_local + pCVar5->size,
                     (uint8_t *)((long)_dsize + (ulong)s_00->size),ssize);
      return;
    }
    goto LAB_0017cd73;
  case 0x21:
  case 0x22:
  case 0x23:
    local_84 = d->info & 0xffff;
    pCVar5 = cts->tab;
    uVar6 = (ulong)local_84;
    local_1a0 = d;
    local_198 = cts;
    local_80 = cts;
    local_74 = local_84;
    local_70 = cts;
    lj_cconv_ct_ct(cts,pCVar5 + uVar6,s,dp,sp,flags);
    _dsize = (float *)sp_local;
    uVar2 = pCVar5[uVar6].size;
    for (; uVar2 < dinfo; dinfo = dinfo - uVar2) {
      sp_local = sp_local + uVar2;
      memcpy(sp_local,_dsize,(ulong)uVar2);
    }
    break;
  case 0x24:
    if (dinfo != sinfo) goto LAB_0017cd92;
    goto LAB_0017cd73;
  case 0x29:
    if ((flags & 1) == 0) goto LAB_0017cd92;
    local_1f8 = 0x800000;
LAB_0017c0cf:
    if (sinfo < dinfo) {
      bVar7 = false;
      if ((tmpptr._4_4_ & 0x800000) == 0) {
        bVar7 = (*(byte *)((long)_dsize + (ulong)(sinfo - 1)) & 0x80) != 0;
      }
      bVar3 = 0;
      if (bVar7) {
        bVar3 = 0xff;
      }
      memcpy(dp,_dsize,(ulong)sinfo);
      memset(sp_local + sinfo,(uint)bVar3,(ulong)(dinfo - sinfo));
    }
    else {
      memcpy(dp,_dsize,(ulong)dinfo);
    }
    break;
  case 0x2a:
    if (((flags & 1) == 0) || ((flags & 2) == 0)) goto LAB_0017cd92;
    local_1f8 = 0x800000;
    if (dinfo == 8) {
      local_1f8 = 0;
    }
LAB_0017c1a8:
    if (sinfo == 8) {
      dStack_218 = *(double *)sp;
    }
    else {
      if (sinfo != 4) goto LAB_0017cd92;
      dStack_218 = (double)*(float *)sp;
    }
    if ((dinfo < 4) || ((dinfo == 4 && ((local_1f8 & 0x800000) == 0)))) {
      iVar4 = (int)dStack_218;
      if (dinfo == 4) {
        *(int *)dp = iVar4;
      }
      else if (dinfo == 2) {
        *(short *)dp = (short)iVar4;
      }
      else {
        *dp = (uint8_t)iVar4;
      }
    }
    else if (dinfo == 4) {
      *(int *)dp = (int)(long)dStack_218;
    }
    else {
      if (dinfo != 8) {
LAB_0017cd92:
        cconv_err_conv((CTState *)d_local,s_local,(CType *)dp_local,ssize);
      }
      if ((local_1f8 & 0x800000) == 0) {
        *(long *)dp = (long)dStack_218;
      }
      else {
        _idx = (long)dStack_218;
        if (_idx < 0) {
          _idx = (long)(dStack_218 - 1.8446744073709552e+19);
        }
        *(long *)dp = _idx;
      }
    }
    break;
  case 0x2d:
    iVar4 = lj_cconv_compatptr(cts,d,s,flags);
    if (iVar4 == 0) goto LAB_0017cd92;
    if (sinfo == 4) {
      local_f0 = (ulong)(uint)*_dsize;
    }
    else {
      local_f0 = *(ulong *)_dsize;
    }
    if (dinfo == 4) {
      *(int *)sp_local = (int)local_f0;
    }
    else {
      *(ulong *)sp_local = local_f0;
    }
    break;
  case 0x2e:
  case 0x2f:
    iVar4 = lj_cconv_compatptr(cts,d,s,flags);
    if (iVar4 == 0) goto LAB_0017cd92;
    if (dinfo == 4) {
      *(int *)sp_local = (int)_dsize;
    }
    else {
      *(float **)sp_local = _dsize;
    }
    break;
  case 0x36:
    if ((((flags & 1) != 0) || ((d->info & 0x100000) != 0)) ||
       ((dinfo != sinfo ||
        ((d->size == 0xffffffff || (iVar4 = lj_cconv_compatptr(cts,d,s,flags), iVar4 == 0))))))
    goto LAB_0017cd92;
    goto LAB_0017cd73;
  case 0x3f:
    if ((((flags & 1) != 0) || ((d->info & 0x100000) != 0)) || (d != s)) goto LAB_0017cd92;
LAB_0017cd73:
    memcpy(sp_local,_dsize,(ulong)dinfo);
  }
  return;
}

Assistant:

void lj_cconv_ct_ct(CTState *cts, CType *d, CType *s,
		    uint8_t *dp, uint8_t *sp, CTInfo flags)
{
  CTSize dsize = d->size, ssize = s->size;
  CTInfo dinfo = d->info, sinfo = s->info;
  void *tmpptr;

  lj_assertCTS(!ctype_isenum(dinfo) && !ctype_isenum(sinfo),
	       "unresolved enum");
  lj_assertCTS(!ctype_isattrib(dinfo) && !ctype_isattrib(sinfo),
	       "unstripped attribute");

  if (ctype_type(dinfo) > CT_MAYCONVERT || ctype_type(sinfo) > CT_MAYCONVERT)
    goto err_conv;

  /* Some basic sanity checks. */
  lj_assertCTS(!ctype_isnum(dinfo) || dsize > 0, "bad size for number type");
  lj_assertCTS(!ctype_isnum(sinfo) || ssize > 0, "bad size for number type");
  lj_assertCTS(!ctype_isbool(dinfo) || dsize == 1 || dsize == 4,
	       "bad size for bool type");
  lj_assertCTS(!ctype_isbool(sinfo) || ssize == 1 || ssize == 4,
	       "bad size for bool type");
  lj_assertCTS(!ctype_isinteger(dinfo) || (1u<<lj_fls(dsize)) == dsize,
	       "bad size for integer type");
  lj_assertCTS(!ctype_isinteger(sinfo) || (1u<<lj_fls(ssize)) == ssize,
	       "bad size for integer type");

  switch (cconv_idx2(dinfo, sinfo)) {
  /* Destination is a bool. */
  case CCX(B, B):
    /* Source operand is already normalized. */
    if (dsize == 1) *dp = *sp; else *(int *)dp = *sp;
    break;
  case CCX(B, I): {
    MSize i;
    uint8_t b = 0;
    for (i = 0; i < ssize; i++) b |= sp[i];
    b = (b != 0);
    if (dsize == 1) *dp = b; else *(int *)dp = b;
    break;
    }
  case CCX(B, F): {
    uint8_t b;
    if (ssize == sizeof(double)) b = (*(double *)sp != 0);
    else if (ssize == sizeof(float)) b = (*(float *)sp != 0);
    else goto err_conv;  /* NYI: long double. */
    if (dsize == 1) *dp = b; else *(int *)dp = b;
    break;
    }

  /* Destination is an integer. */
  case CCX(I, B):
  case CCX(I, I):
  conv_I_I:
    if (dsize > ssize) {  /* Zero-extend or sign-extend LSB. */
#if LJ_LE
      uint8_t fill = (!(sinfo & CTF_UNSIGNED) && (sp[ssize-1]&0x80)) ? 0xff : 0;
      memcpy(dp, sp, ssize);
      memset(dp + ssize, fill, dsize-ssize);
#else
      uint8_t fill = (!(sinfo & CTF_UNSIGNED) && (sp[0]&0x80)) ? 0xff : 0;
      memset(dp, fill, dsize-ssize);
      memcpy(dp + (dsize-ssize), sp, ssize);
#endif
    } else {  /* Copy LSB. */
#if LJ_LE
      memcpy(dp, sp, dsize);
#else
      memcpy(dp, sp + (ssize-dsize), dsize);
#endif
    }
    break;
  case CCX(I, F): {
    double n;  /* Always convert via double. */
  conv_I_F:
    /* Convert source to double. */
    if (ssize == sizeof(double)) n = *(double *)sp;
    else if (ssize == sizeof(float)) n = (double)*(float *)sp;
    else goto err_conv;  /* NYI: long double. */
    /* Then convert double to integer. */
    /* The conversion must exactly match the semantics of JIT-compiled code! */
    if (dsize < 4 || (dsize == 4 && !(dinfo & CTF_UNSIGNED))) {
      int32_t i = (int32_t)n;
      if (dsize == 4) *(int32_t *)dp = i;
      else if (dsize == 2) *(int16_t *)dp = (int16_t)i;
      else *(int8_t *)dp = (int8_t)i;
    } else if (dsize == 4) {
      *(uint32_t *)dp = (uint32_t)n;
    } else if (dsize == 8) {
      if (!(dinfo & CTF_UNSIGNED))
	*(int64_t *)dp = (int64_t)n;
      else
	*(uint64_t *)dp = lj_num2u64(n);
    } else {
      goto err_conv;  /* NYI: conversion to >64 bit integers. */
    }
    break;
    }
  case CCX(I, C):
    s = ctype_child(cts, s);
    sinfo = s->info;
    ssize = s->size;
    goto conv_I_F;  /* Just convert re. */
  case CCX(I, P):
    if (!(flags & CCF_CAST)) goto err_conv;
    sinfo = CTINFO(CT_NUM, CTF_UNSIGNED);
    goto conv_I_I;
  case CCX(I, A):
    if (!(flags & CCF_CAST)) goto err_conv;
    sinfo = CTINFO(CT_NUM, CTF_UNSIGNED);
    ssize = CTSIZE_PTR;
    tmpptr = sp;
    sp = (uint8_t *)&tmpptr;
    goto conv_I_I;

  /* Destination is a floating-point number. */
  case CCX(F, B):
  case CCX(F, I): {
    double n;  /* Always convert via double. */
  conv_F_I:
    /* First convert source to double. */
    /* The conversion must exactly match the semantics of JIT-compiled code! */
    if (ssize < 4 || (ssize == 4 && !(sinfo & CTF_UNSIGNED))) {
      int32_t i;
      if (ssize == 4) {
	i = *(int32_t *)sp;
      } else if (!(sinfo & CTF_UNSIGNED)) {
	if (ssize == 2) i = *(int16_t *)sp;
	else i = *(int8_t *)sp;
      } else {
	if (ssize == 2) i = *(uint16_t *)sp;
	else i = *(uint8_t *)sp;
      }
      n = (double)i;
    } else if (ssize == 4) {
      n = (double)*(uint32_t *)sp;
    } else if (ssize == 8) {
      if (!(sinfo & CTF_UNSIGNED)) n = (double)*(int64_t *)sp;
      else n = (double)*(uint64_t *)sp;
    } else {
      goto err_conv;  /* NYI: conversion from >64 bit integers. */
    }
    /* Convert double to destination. */
    if (dsize == sizeof(double)) *(double *)dp = n;
    else if (dsize == sizeof(float)) *(float *)dp = (float)n;
    else goto err_conv;  /* NYI: long double. */
    break;
    }
  case CCX(F, F): {
    double n;  /* Always convert via double. */
  conv_F_F:
    if (ssize == dsize) goto copyval;
    /* Convert source to double. */
    if (ssize == sizeof(double)) n = *(double *)sp;
    else if (ssize == sizeof(float)) n = (double)*(float *)sp;
    else goto err_conv;  /* NYI: long double. */
    /* Convert double to destination. */
    if (dsize == sizeof(double)) *(double *)dp = n;
    else if (dsize == sizeof(float)) *(float *)dp = (float)n;
    else goto err_conv;  /* NYI: long double. */
    break;
    }
  case CCX(F, C):
    s = ctype_child(cts, s);
    sinfo = s->info;
    ssize = s->size;
    goto conv_F_F;  /* Ignore im, and convert from re. */

  /* Destination is a complex number. */
  case CCX(C, I):
    d = ctype_child(cts, d);
    dinfo = d->info;
    dsize = d->size;
    memset(dp + dsize, 0, dsize);  /* Clear im. */
    goto conv_F_I;  /* Convert to re. */
  case CCX(C, F):
    d = ctype_child(cts, d);
    dinfo = d->info;
    dsize = d->size;
    memset(dp + dsize, 0, dsize);  /* Clear im. */
    goto conv_F_F;  /* Convert to re. */

  case CCX(C, C):
    if (dsize != ssize) {  /* Different types: convert re/im separately. */
      CType *dc = ctype_child(cts, d);
      CType *sc = ctype_child(cts, s);
      lj_cconv_ct_ct(cts, dc, sc, dp, sp, flags);
      lj_cconv_ct_ct(cts, dc, sc, dp + dc->size, sp + sc->size, flags);
      return;
    }
    goto copyval;  /* Otherwise this is easy. */

  /* Destination is a vector. */
  case CCX(V, I):
  case CCX(V, F):
  case CCX(V, C): {
    CType *dc = ctype_child(cts, d);
    CTSize esize;
    /* First convert the scalar to the first element. */
    lj_cconv_ct_ct(cts, dc, s, dp, sp, flags);
    /* Then replicate it to the other elements (splat). */
    for (sp = dp, esize = dc->size; dsize > esize; dsize -= esize) {
      dp += esize;
      memcpy(dp, sp, esize);
    }
    break;
    }

  case CCX(V, V):
    /* Copy same-sized vectors, even for different lengths/element-types. */
    if (dsize != ssize) goto err_conv;
    goto copyval;

  /* Destination is a pointer. */
  case CCX(P, I):
    if (!(flags & CCF_CAST)) goto err_conv;
    dinfo = CTINFO(CT_NUM, CTF_UNSIGNED);
    goto conv_I_I;

  case CCX(P, F):
    if (!(flags & CCF_CAST) || !(flags & CCF_FROMTV)) goto err_conv;
    /* The signed conversion is cheaper. x64 really has 47 bit pointers. */
    dinfo = CTINFO(CT_NUM, (LJ_64 && dsize == 8) ? 0 : CTF_UNSIGNED);
    goto conv_I_F;

  case CCX(P, P):
    if (!lj_cconv_compatptr(cts, d, s, flags)) goto err_conv;
    cdata_setptr(dp, dsize, cdata_getptr(sp, ssize));
    break;

  case CCX(P, A):
  case CCX(P, S):
    if (!lj_cconv_compatptr(cts, d, s, flags)) goto err_conv;
    cdata_setptr(dp, dsize, sp);
    break;

  /* Destination is an array. */
  case CCX(A, A):
    if ((flags & CCF_CAST) || (d->info & CTF_VLA) || dsize != ssize ||
	d->size == CTSIZE_INVALID || !lj_cconv_compatptr(cts, d, s, flags))
      goto err_conv;
    goto copyval;

  /* Destination is a struct/union. */
  case CCX(S, S):
    if ((flags & CCF_CAST) || (d->info & CTF_VLA) || d != s)
      goto err_conv;  /* Must be exact same type. */
copyval:  /* Copy value. */
    lj_assertCTS(dsize == ssize, "value copy with different sizes");
    memcpy(dp, sp, dsize);
    break;

  default:
  err_conv:
    cconv_err_conv(cts, d, s, flags);
  }
}